

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v5::report_system_error(int error_code,string_view message)

{
  size_t in_R8;
  string_view message_00;
  undefined **local_238;
  undefined1 *local_230;
  size_t sStack_228;
  undefined8 local_220;
  undefined1 local_218 [504];
  
  sStack_228 = 0;
  local_238 = &PTR_grow_00177ff0;
  local_220 = 500;
  message_00.size_ = in_R8;
  message_00.data_ = (char *)message.size_;
  local_230 = local_218;
  format_system_error((v5 *)&local_238,(buffer *)(ulong)(uint)error_code,(int)message.data_,
                      message_00);
  fwrite(local_230,sStack_228,1,_stderr);
  fputc(10,_stderr);
  local_238 = &PTR_grow_00177ff0;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  return;
}

Assistant:

FMT_FUNC void report_system_error(
    int error_code, fmt::string_view message) FMT_NOEXCEPT {
  report_error(format_system_error, error_code, message);
}